

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O2

Unique<Entry<NurbsSurfaceGeometry<3L>_>_> __thiscall
anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>::create
          (Entry<anurbs::NurbsSurfaceGeometry<3L>_> *this,
          shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> *data)

{
  Pointer<Attributes> attributes;
  unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_> local_30;
  shared_ptr<anurbs::Attributes> local_28;
  
  new_<anurbs::Attributes>();
  std::__shared_ptr<anurbs::Attributes,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::Attributes,std::default_delete<anurbs::Attributes>,void>
            ((__shared_ptr<anurbs::Attributes,(__gnu_cxx::_Lock_policy)2> *)&local_28,&local_30);
  std::unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_>::~unique_ptr
            (&local_30);
  new_<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>&,std::shared_ptr<anurbs::Attributes>&>
            ((anurbs *)this,data,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Entry<TData>> create(std::shared_ptr<TData> data)
    {
        Pointer<Attributes> attributes = new_<Attributes>();
        return new_<Entry<TData>>(data, attributes);
    }